

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

bool __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::insert_media
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false> *this,Media *media)

{
  bool bVar1;
  DiskIICard *this_00;
  const_reference disk;
  SCSICard *this_01;
  const_reference device;
  SCSICard *scsi;
  DiskIICard *diskii;
  Media *media_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false> *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&media->disks);
  if ((!bVar1) && (this_00 = diskii_card(this), this_00 != (DiskIICard *)0x0)) {
    disk = std::
           vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ::operator[](&media->disks,0);
    DiskIICard::set_disk(this_00,disk,0);
  }
  bVar1 = std::
          vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
          ::empty(&media->mass_storage_devices);
  if ((!bVar1) && (this_01 = scsi_card(this), this_01 != (SCSICard *)0x0)) {
    device = std::
             vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
             ::operator[](&media->mass_storage_devices,0);
    SCSICard::set_storage_device(this_01,device);
  }
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.disks.empty()) {
				auto diskii = diskii_card();
				if(diskii) diskii->set_disk(media.disks[0], 0);
			}

			if(!media.mass_storage_devices.empty()) {
				auto scsi = scsi_card();
				if(scsi) scsi->set_storage_device(media.mass_storage_devices[0]);
			}

			return true;
		}